

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::BeginRenderPass
          (DeviceContextGLImpl *this,BeginRenderPassAttribs *Attribs)

{
  undefined2 uVar1;
  Float32 FVar2;
  undefined3 uVar3;
  bool bVar4;
  OptimizedClearValue *pOVar5;
  reference pvVar6;
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  Uint32 i;
  BeginRenderPassAttribs *Attribs_local;
  DeviceContextGLImpl *this_local;
  
  DeviceContextBase<Diligent::EngineGLImplTraits>::BeginRenderPass
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs);
  std::vector<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>::resize
            (&this->m_AttachmentClearValues,(ulong)Attribs->ClearValueCount);
  for (msg.field_2._12_4_ = 0; (uint)msg.field_2._12_4_ < Attribs->ClearValueCount;
      msg.field_2._12_4_ = msg.field_2._12_4_ + 1) {
    pOVar5 = Attribs->pClearValues + (uint)msg.field_2._12_4_;
    pvVar6 = std::
             vector<Diligent::OptimizedClearValue,_std::allocator<Diligent::OptimizedClearValue>_>::
             operator[](&this->m_AttachmentClearValues,(ulong)(uint)msg.field_2._12_4_);
    uVar1 = *(undefined2 *)&pOVar5->field_0x2;
    FVar2 = pOVar5->Color[0];
    pvVar6->Format = pOVar5->Format;
    *(undefined2 *)&pvVar6->field_0x2 = uVar1;
    pvVar6->Color[0] = FVar2;
    *(undefined8 *)(pvVar6->Color + 1) = *(undefined8 *)(pOVar5->Color + 1);
    *(undefined8 *)(pvVar6->Color + 3) = *(undefined8 *)(pOVar5->Color + 3);
    uVar3 = *(undefined3 *)&(pOVar5->DepthStencil).field_0x5;
    (pvVar6->DepthStencil).Stencil = (pOVar5->DepthStencil).Stencil;
    *(undefined3 *)&(pvVar6->DepthStencil).field_0x5 = uVar3;
  }
  bVar4 = RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator!
                    (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                      m_pBoundFramebuffer);
  if (bVar4) {
    FormatString<char[26],char[20]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pBoundFramebuffer",(char (*) [20])Attribs);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x28d);
    std::__cxx11::string::~string((string *)local_40);
  }
  SetViewports(this,1,(Viewport *)0x0,0,0);
  BeginSubpass(this);
  return;
}

Assistant:

void DeviceContextGLImpl::BeginRenderPass(const BeginRenderPassAttribs& Attribs)
{
    TDeviceContextBase::BeginRenderPass(Attribs);

    m_AttachmentClearValues.resize(Attribs.ClearValueCount);
    for (Uint32 i = 0; i < Attribs.ClearValueCount; ++i)
        m_AttachmentClearValues[i] = Attribs.pClearValues[i];

    VERIFY_EXPR(m_pBoundFramebuffer);

    SetViewports(1, nullptr, 0, 0);

    BeginSubpass();
}